

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

ShaderModuleWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateShaderModule
          (ShaderModuleWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkShaderModuleCreateInfo *ShaderModuleCI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (ShaderModuleCI->sType != VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[68]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ShaderModuleCI.sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO",
               (char (*) [68])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateShaderModule",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x14a);
    std::__cxx11::string::~string((string *)&local_48);
  }
  CreateVulkanObject<VkShaderModule_T*,(VulkanUtilities::VulkanHandleTypeId)10,VkResult(*)(VkDevice_T*,VkShaderModuleCreateInfo_const*,VkAllocationCallbacks_const*,VkShaderModule_T**),VkShaderModuleCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkShaderModuleCreateInfo_ptr_VkAllocationCallbacks_ptr_VkShaderModule_T_ptr_ptr
              *)vkCreateShaderModule,ShaderModuleCI,DebugName,"shader module");
  return __return_storage_ptr__;
}

Assistant:

ShaderModuleWrapper VulkanLogicalDevice::CreateShaderModule(const VkShaderModuleCreateInfo& ShaderModuleCI, const char* DebugName) const
{
    VERIFY_EXPR(ShaderModuleCI.sType == VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO);
    return CreateVulkanObject<VkShaderModule, VulkanHandleTypeId::ShaderModule>(vkCreateShaderModule, ShaderModuleCI, DebugName, "shader module");
}